

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapAllocator.cpp
# Opt level: O3

void __thiscall Memory::HeapAllocator::ClearTrackAllocInfo(HeapAllocator *this,TrackAllocData *data)

{
  long *plVar1;
  undefined4 *puVar2;
  code *pcVar3;
  type_info *ptVar4;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  undefined8 *in_FS_OFFSET;
  
  plVar1 = (long *)*in_FS_OFFSET;
  if (((*plVar1 == 0) && (plVar1[1] == 0)) && (plVar1[2] == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapAllocator.cpp"
                       ,0xd3,"(!nextAllocData.IsEmpty())","!nextAllocData.IsEmpty()");
    if (!bVar7) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  if (data != (TrackAllocData *)0x0) {
    *(long *)&data->line = plVar1[4];
    ptVar4 = (type_info *)*plVar1;
    sVar5 = plVar1[1];
    pcVar6 = (char *)plVar1[3];
    data->count = plVar1[2];
    data->filename = pcVar6;
    data->typeinfo = ptVar4;
    data->plusSize = sVar5;
  }
  *plVar1 = 0;
  plVar1[1] = 0;
  plVar1[2] = 0;
  return;
}

Assistant:

void HeapAllocator::ClearTrackAllocInfo(TrackAllocData* data/* = NULL*/)
{
#ifdef HEAP_TRACK_ALLOC
    Assert(!nextAllocData.IsEmpty());
    if (data)
    {
        *data = nextAllocData;
    }
    nextAllocData.Clear();
#endif
}